

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# counting.hpp
# Opt level: O1

double ising::counting::free_energy<lattice::graph>
                 (double beta,graph *lat,vector<double,_std::allocator<double>_> *inter,
                 vector<double,_std::allocator<double>_> *field)

{
  long lVar1;
  pointer pbVar2;
  invalid_argument *this;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  unsigned_long c;
  bool bVar6;
  double __x;
  double dVar7;
  exp_double weight;
  exp_double sum;
  exp_number<double> local_70;
  double local_60;
  exp_number<double> local_58;
  ulong local_48;
  exp_number<double> local_40;
  
  local_60 = beta;
  if (beta <= 0.0) {
    this = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(this,"beta should be positive");
  }
  else {
    uVar3 = ((long)(lat->sites_).
                   super__Vector_base<lattice::graph::site_t,_std::allocator<lattice::graph::site_t>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(lat->sites_).
                   super__Vector_base<lattice::graph::site_t,_std::allocator<lattice::graph::site_t>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 3) * 0x6db6db6db6db6db7;
    if (uVar3 < 0x1f) {
      if ((long)(inter->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(inter->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_start >> 3 ==
          ((long)(lat->bonds_).
                 super__Vector_base<lattice::graph::bond_t,_std::allocator<lattice::graph::bond_t>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)(lat->bonds_).
                 super__Vector_base<lattice::graph::bond_t,_std::allocator<lattice::graph::bond_t>_>
                 ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555) {
        lVar1 = (long)(field->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)(field->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                      super__Vector_impl_data._M_start;
        if ((lVar1 == 0) || (lVar1 >> 3 == uVar3)) {
          local_48 = (ulong)(1 << ((byte)uVar3 & 0x1f));
          local_40.sign_ = 0;
          local_40.log_ = 0.0;
          uVar3 = 0;
          do {
            local_70.sign_ = 1;
            local_70.log_ = 0.0;
            pbVar2 = (lat->bonds_).
                     super__Vector_base<lattice::graph::bond_t,_std::allocator<lattice::graph::bond_t>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            if ((lat->bonds_).
                super__Vector_base<lattice::graph::bond_t,_std::allocator<lattice::graph::bond_t>_>.
                _M_impl.super__Vector_impl_data._M_finish != pbVar2) {
              uVar4 = 0;
              uVar5 = 1;
              do {
                standards::exp_number<double>::exp_number
                          (&local_58,
                           (double)(int)(1 - (((uint)(uVar3 >> ((byte)pbVar2[uVar4].target & 0x3f))
                                              ^ (uint)(uVar3 >> ((byte)pbVar2[uVar4].source & 0x3f))
                                              ) * 2 & 2)) *
                           (inter->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                           super__Vector_impl_data._M_start[uVar4] * local_60);
                local_70.log_ = local_70.log_ + local_58.log_;
                local_70.sign_ = local_70.sign_ * local_58.sign_;
                if (ABS(local_70.log_ / local_58.log_) < 1e-10) {
                  local_70.log_ = 0.0;
                }
                pbVar2 = (lat->bonds_).
                         super__Vector_base<lattice::graph::bond_t,_std::allocator<lattice::graph::bond_t>_>
                         ._M_impl.super__Vector_impl_data._M_start;
                uVar4 = ((long)(lat->bonds_).
                               super__Vector_base<lattice::graph::bond_t,_std::allocator<lattice::graph::bond_t>_>
                               ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar2 >> 3) *
                        -0x5555555555555555;
                bVar6 = uVar5 <= uVar4;
                lVar1 = uVar4 - uVar5;
                uVar4 = uVar5;
                uVar5 = (ulong)((int)uVar5 + 1);
              } while (bVar6 && lVar1 != 0);
            }
            if (((field->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_finish !=
                 (field->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start) &&
               ((lat->sites_).
                super__Vector_base<lattice::graph::site_t,_std::allocator<lattice::graph::site_t>_>.
                _M_impl.super__Vector_impl_data._M_finish !=
                (lat->sites_).
                super__Vector_base<lattice::graph::site_t,_std::allocator<lattice::graph::site_t>_>.
                _M_impl.super__Vector_impl_data._M_start)) {
              uVar4 = 0;
              uVar5 = 1;
              do {
                standards::exp_number<double>::exp_number
                          (&local_58,
                           (double)(int)(1 - ((int)(uVar3 >> ((byte)uVar4 & 0x3f)) * 2 & 2U)) *
                           (field->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                           super__Vector_impl_data._M_start[uVar4] * local_60);
                local_70.log_ = local_70.log_ + local_58.log_;
                local_70.sign_ = local_70.sign_ * local_58.sign_;
                if (ABS(local_70.log_ / local_58.log_) < 1e-10) {
                  local_70.log_ = 0.0;
                }
                uVar4 = ((long)(lat->sites_).
                               super__Vector_base<lattice::graph::site_t,_std::allocator<lattice::graph::site_t>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                         (long)(lat->sites_).
                               super__Vector_base<lattice::graph::site_t,_std::allocator<lattice::graph::site_t>_>
                               ._M_impl.super__Vector_impl_data._M_start >> 3) * 0x6db6db6db6db6db7;
                bVar6 = uVar5 <= uVar4;
                lVar1 = uVar4 - uVar5;
                uVar4 = uVar5;
                uVar5 = (ulong)((int)uVar5 + 1);
              } while (bVar6 && lVar1 != 0);
            }
            standards::exp_number<double>::operator+=(&local_40,&local_70);
            uVar3 = uVar3 + 1;
          } while (uVar3 != local_48);
          dVar7 = standards::exp_number<double>::log(&local_40,__x);
          return -dVar7 / local_60;
        }
        this = (invalid_argument *)__cxa_allocate_exception(0x10);
        std::invalid_argument::invalid_argument(this,"inconsitent table size of external field");
      }
      else {
        this = (invalid_argument *)__cxa_allocate_exception(0x10);
        std::invalid_argument::invalid_argument(this,"inconsitent table size of interaction");
      }
    }
    else {
      this = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::invalid_argument::invalid_argument(this,"too large lattice");
    }
  }
  __cxa_throw(this,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

static double free_energy(double beta, LATTICE const& lat, std::vector<double> const& inter,
                            std::vector<double> const& field = std::vector<double>(0)) {
    if (beta <= 0)
      throw(std::invalid_argument("beta should be positive"));
    if (lat.num_sites() > 30)
      throw(std::invalid_argument("too large lattice"));
    if (inter.size() != lat.num_bonds())
      throw(std::invalid_argument("inconsitent table size of interaction"));
    if (field.size() > 0 && field.size() != lat.num_sites())
      throw(std::invalid_argument("inconsitent table size of external field"));
    unsigned long num_states = 1 << lat.num_sites();
    standards::exp_double sum = 0;
    for (unsigned long c = 0; c < num_states; ++c) {
      standards::exp_double weight = 1;
      for (unsigned int b = 0; b < lat.num_bonds(); ++b) {
        int ci = (c >> lat.source(b)) & 1;
        int cj = (c >> lat.target(b)) & 1;
        weight *= standards::exp_number<double>(beta * inter[b] * (1 - 2 * (ci ^ cj)));
      }
      if (field.size()) {
        for (unsigned int s = 0; s < lat.num_sites(); ++s) {
          int c0 = (c >> s) & 1;
          weight *= standards::exp_number<double>(beta * field[s] * (1 - 2 * c0));
        }
      }
      sum += weight;
    }
    return -log(sum) / beta;
  }